

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::insert(String *this,size_t pos1,char *s)

{
  StringBaseType *__s;
  undefined1 local_40 [8];
  String tmp;
  char *s_local;
  size_t pos1_local;
  String *this_local;
  
  tmp.mString.field_2._8_8_ = s;
  String((String *)local_40,s);
  __s = data((String *)local_40);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  insert(&this->mString,pos1,__s);
  ~String((String *)local_40);
  return this;
}

Assistant:

String& String::insert( size_t pos1, const char* s ) {
	String tmp( s );

	mString.insert( pos1, tmp.data() );

	return *this;
}